

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O1

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedFeature(DiagnosticsReporter *this,string *name)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  DiagnosticDescriptor local_90;
  
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,ID_of_ExpectedFeature_abi_cxx11_._M_dataplus._M_p,
             ID_of_ExpectedFeature_abi_cxx11_._M_dataplus._M_p +
             ID_of_ExpectedFeature_abi_cxx11_._M_string_length);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"[[unexpected extension or C dialect]]","");
  pcVar1 = (name->_M_dataplus)._M_p;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)local_f0);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_90,local_b0,local_d0,local_f0,1,1);
  diagnoseOrDelayDiagnostic(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.description_._M_dataplus._M_p != &local_90.description_.field_2) {
    operator_delete(local_90.description_._M_dataplus._M_p,
                    local_90.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.title_._M_dataplus._M_p != &local_90.title_.field_2) {
    operator_delete(local_90.title_._M_dataplus._M_p,
                    local_90.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.id_._M_dataplus._M_p != &local_90.id_.field_2) {
    operator_delete(local_90.id_._M_dataplus._M_p,local_90.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedFeature(const std::string& name)
{
    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedFeature,
                                     "[[unexpected extension or C dialect]]",
                                     name + " is either an extension or unsupported in this dialect",
                                     DiagnosticSeverity::Warning,
                                     DiagnosticCategory::Syntax));
}